

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void factor(item *x)

{
  int iVar1;
  item *x_00;
  object *y;
  object **ppoVar2;
  object *fp;
  int iVar3;
  char *msg;
  
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol == 0x12d) {
    getSymbol();
    expression(x);
    if (currentSymbol != 0x12e) {
      msg = "missing right paranetheses";
LAB_00106abe:
      mark(msg);
      exit(-1);
    }
  }
  else {
    if (currentSymbol == 0x1f8) {
      iVar1 = charTypeIndex;
      iVar3 = (int)idName[0];
    }
    else {
      iVar1 = intTypeIndex;
      iVar3 = numberVal;
      if (currentSymbol != 0x1f6) {
        if (currentSymbol == 0x1f5) {
          y = find();
          getSymbol();
          makeItem(x,y);
          if (x->mode == 0x2c4) {
            param(x_00);
            if (6 < y->val) {
              return;
            }
            IOCall(x,x_00);
            return;
          }
          if (x->mode != 0x2c0) {
            selector(x);
            return;
          }
          ppoVar2 = &y->dsc;
          if (y->val < 0) {
            ppoVar2 = &(*ppoVar2)->next;
          }
          fp = *ppoVar2;
          if (currentSymbol == 0x12d) {
            getSymbol();
            while (currentSymbol != 0x12e) {
              while (fp = parameter(fp), currentSymbol == 0xcc) {
                getSymbol();
              }
            }
            getSymbol();
          }
          iVar1 = isParameter(fp);
          if (iVar1 == 0) {
            if (y->val < 0) {
              fp = (object *)(ulong)(uint)pc;
              addProcToFixList(pc,y);
              iVar1 = 0;
            }
            else {
              iVar1 = x->a - pc;
            }
            call((item *)fp,iVar1);
            return;
          }
          msg = "too few parameters";
        }
        else {
          msg = "factor ?";
        }
        goto LAB_00106abe;
      }
    }
    x->mode = 0x2bd;
    x->typeIndex = iVar1;
    x->a = iVar3;
    x->b = 0;
    x->c = 0;
    x->idx = 0;
    x->lev = 0;
    x->r = 0;
  }
  getSymbol();
  return;
}

Assistant:

procedure 
void factor(struct item *x) {
	variable struct object *obj; variable struct object *par; variable struct object *procObj;
	variable struct item *y;
	variable bool cond;
	variable int jumpTo;
	obj = NULL; par = NULL; procObj = NULL; cond = true; jumpTo = 0; 
	allocMem(y);
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		obj = find();
		getSymbol();
		makeItem(x,obj);
		if (x->mode == CLASS_PROC) { 
			procObj = obj;
			if (procObj->val < 0) { /* prototype => dsc still points to head for further use */
				par = obj->dsc->next;
			} else {
				par = obj->dsc;
			}
			if (currentSymbol == SYMBOL_LPARAN) { 
				getSymbol(); 
				if (currentSymbol == SYMBOL_RPARAN) {
					getSymbol();
				} else {
					par = parameter(par);
					while (cond == true) {
						if (currentSymbol == SYMBOL_COMMA) {
							getSymbol();
						} elsif (currentSymbol == SYMBOL_RPARAN) {
							getSymbol();
							cond = false;
						}
						if (cond == true) {
							par = parameter(par);
						}
					}
				}
			}
			if (isParameter(par) != true) {
				if (procObj->val < 0) {
					addProcToFixList(pc,procObj);
					jumpTo = 0;
				} else {
					jumpTo = x->a - pc;
				}
				call(x,jumpTo);
			} else {
				mark("too few parameters");
				exit(-1);
			}
		} elsif (x->mode == CLASS_SPROC) { 
			param(y);
			if (obj->val <= 6) {
				IOCall(x,y);
			}
		} else {
			selector(x);
		}
	}